

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_DecodeToBuf(CLzmaDec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  SizeT SVar1;
  ELzmaFinishMode finishMode_00;
  SRes SVar2;
  SizeT SVar3;
  size_t __n;
  SizeT SVar4;
  SizeT inSizeCur;
  Byte *local_68;
  SizeT local_60;
  SizeT *local_58;
  SizeT *local_50;
  SizeT local_48;
  ulong local_40;
  Byte *local_38;
  
  local_40 = *destLen;
  local_60 = *srcLen;
  *destLen = 0;
  *srcLen = 0;
  local_68 = dest;
  local_58 = destLen;
  local_50 = srcLen;
  do {
    SVar4 = p->dicPos;
    SVar1 = p->dicBufSize;
    if (SVar4 == SVar1) {
      p->dicPos = 0;
      SVar4 = 0;
    }
    SVar3 = SVar4 + local_40;
    if (SVar1 - SVar4 < local_40) {
      SVar3 = SVar1;
    }
    finishMode_00 = finishMode;
    if (SVar1 - SVar4 < local_40) {
      finishMode_00 = LZMA_FINISH_ANY;
    }
    local_48 = local_60;
    local_38 = src;
    SVar2 = LzmaDec_DecodeToDic(p,SVar3,src,&local_60,finishMode_00,status);
    SVar3 = local_60;
    *local_50 = *local_50 + local_60;
    SVar1 = p->dicPos;
    __n = SVar1 - SVar4;
    memcpy(local_68,p->dic + SVar4,__n);
    *local_58 = *local_58 + __n;
    if (SVar2 != 0) {
      return SVar2;
    }
    if (SVar1 == SVar4) {
      return 0;
    }
    local_40 = local_40 - __n;
    local_68 = local_68 + __n;
    local_60 = local_48 - SVar3;
    src = local_38 + SVar3;
  } while (local_40 != 0);
  return 0;
}

Assistant:

SRes LzmaDec_DecodeToBuf(CLzmaDec *p, Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT outSize = *destLen;
  SizeT inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;)
  {
    SizeT inSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->dicPos == p->dicBufSize)
      p->dicPos = 0;
    dicPos = p->dicPos;
    if (outSize > p->dicBufSize - dicPos)
    {
      outSizeCur = p->dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    }
    else
    {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = LzmaDec_DecodeToDic(p, outSizeCur, src, &inSizeCur, curFinishMode, status);
    src += inSizeCur;
    inSize -= inSizeCur;
    *srcLen += inSizeCur;
    outSizeCur = p->dicPos - dicPos;
    memcpy(dest, p->dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}